

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateDebugReportObjectType
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *objectType)

{
  VulkanHppGenerator *pVVar1;
  pointer pcVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  const_iterator cVar5;
  VulkanHppGenerator *this_00;
  string debugReportObjectType;
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  pcVar2 = (objectType->_M_dataplus)._M_p;
  local_48._M_allocated_capacity = (size_type)&local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + objectType->_M_string_length);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48
                      ,3,0,"DEBUG_REPORT_",0xd);
  pVVar1 = (VulkanHppGenerator *)(local_68 + 0x10);
  pcVar2 = (pbVar4->_M_dataplus)._M_p;
  local_68._0_8_ = pVVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar2,pcVar2 + pbVar4->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,"_EXT");
  generateDebugReportObjectType();
  local_68._0_8_ = pVVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"VkDebugReportObjectTypeEXT","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
          ::find(&(this->m_enums)._M_t,(key_type *)local_68);
  this_00 = (VulkanHppGenerator *)local_68._0_8_;
  if ((VulkanHppGenerator *)local_68._0_8_ != pVVar1) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if ((_Rb_tree_header *)cVar5._M_node != &(this->m_enums)._M_t._M_impl.super__Rb_tree_header) {
    bVar3 = contains(this_00,(vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                              *)&cVar5._M_node[5]._M_left,(string *)&local_48);
    if (bVar3) {
      generateEnumValueName
                (__return_storage_ptr__,this,(string *)(cVar5._M_node + 1),(string *)&local_48,false
                );
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"eUnknown","");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_allocated_capacity != &local_38) {
      operator_delete((void *)local_48._M_allocated_capacity,local_38._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("enumIt != m_enums.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0x1972,
                "std::string VulkanHppGenerator::generateDebugReportObjectType(const std::string &) const"
               );
}

Assistant:

std::string VulkanHppGenerator::generateDebugReportObjectType( std::string const & objectType ) const
{
  std::string debugReportObjectType = objectType;
  debugReportObjectType             = debugReportObjectType.replace( 3, 0, "DEBUG_REPORT_" ) + "_EXT";
  auto enumIt                       = m_enums.find( "VkDebugReportObjectTypeEXT" );
  assert( enumIt != m_enums.end() );
  return contains( enumIt->second.values, debugReportObjectType ) ? generateEnumValueName( enumIt->first, debugReportObjectType, false ) : "eUnknown";
}